

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O2

void test_iterators_on_empty_simplex_tree<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>
               (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *tst)

{
  pointer pvVar1;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *ppVar2;
  type_conflict3 tVar3;
  reference rVar4;
  ostream *poVar5;
  Filtration_value *pFVar6;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  vVar7;
  pointer pvVar8;
  undefined **local_168;
  ulong local_160;
  shared_count sStack_158;
  char **local_150;
  transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>
  __begin0;
  Complex_simplex_range local_130;
  undefined1 local_100 [8];
  undefined8 local_f8;
  shared_count sStack_f0;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __end0;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  poVar5 = std::operator<<((ostream *)&std::clog,"Iterator on vertices: ");
  std::endl<char,std::char_traits<char>>(poVar5);
  __begin0.super_type.m_iterator.m_ptr =
       (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
        )(tst->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
  vVar7.m_ptr = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                 *)((long)__begin0.super_type.m_iterator.m_ptr +
                   (tst->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size * 0x18);
  while (__begin0.super_type.m_iterator.m_ptr !=
         (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
          )vVar7.m_ptr) {
    rVar4 = boost::iterators::
            transform_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::return_first,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::use_default,_boost::use_default>
            ::dereference(&__begin0);
    poVar5 = std::operator<<((ostream *)&std::clog,"vertice:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    local_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
    ;
    local_38 = "";
    local_50 = &boost::unit_test::basic_cstring<char_const>::null;
    local_48 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3d,&local_50);
    local_168 = (undefined **)((ulong)local_168 & 0xffffffffffffff00);
    local_160 = 0;
    sStack_158.pi_ = (sp_counted_base *)0x0;
    __end0.sh_.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
          *)0x1815a9;
    __end0.sib_ = (Siblings *)0x1815ae;
    local_130.
    super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin.sib_._0_1_ = 0;
    local_130.
    super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin.sh_.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
          *)&PTR__lazy_ostream_001c1f38;
    local_130.
    super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin.st_ = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)
                   &boost::unit_test::lazy_ostream::inst;
    local_130.
    super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
    .m_End.sh_.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
          *)&__end0;
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
    ;
    local_58 = "";
    boost::test_tools::tt_detail::report_assertion(&local_168,&local_130,&local_60,0x3d,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_158);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::operator++((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                  *)&__begin0);
  }
  poVar5 = std::operator<<((ostream *)&std::clog,"Iterator on simplices: ");
  std::endl<char,std::char_traits<char>>(poVar5);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::complex_simplex_range
            (&local_130,tst);
  __begin0.super_type.m_iterator.m_ptr =
       (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
        )(vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
          )local_130.
           super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin.sh_.m_ptr;
  __begin0._9_7_ =
       local_130.
       super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.sib_._1_7_;
  __begin0._8_1_ =
       local_130.
       super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.sib_._0_1_;
  __end0.sh_.m_ptr =
       local_130.
       super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_End.sh_.m_ptr;
  __end0.sib_ = local_130.
                super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                .m_End.sib_;
  __end0.st_ = local_130.
               super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
               .m_End.st_;
  while( true ) {
    tVar3 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long>
                        *)&__begin0,
                       (iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long>
                        *)&__end0);
    if (!tVar3) break;
    local_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
    ;
    local_68 = "";
    local_80 = &boost::unit_test::basic_cstring<char_const>::null;
    local_78 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x41,&local_80);
    local_100[0] = 0;
    local_f8 = 0;
    sStack_f0.pi_ = (sp_counted_base *)0x0;
    local_90 = "simplex != simplex";
    local_88 = "";
    local_160 = local_160 & 0xffffffffffffff00;
    local_168 = &PTR__lazy_ostream_001c1f38;
    sStack_158.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
    ;
    local_98 = "";
    local_150 = &local_90;
    boost::test_tools::tt_detail::report_assertion(local_100,&local_168,&local_a0,0x41,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_f0);
    Gudhi::
    Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
    ::increment((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
                 *)&__begin0);
  }
  poVar5 = std::operator<<((ostream *)&std::clog,
                           "Iterator on Simplices in the filtration, with [filtration value]:");
  std::endl<char,std::char_traits<char>>(poVar5);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::maybe_initialize_filtration
            (tst);
  pvVar1 = (tst->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar8 = (tst->filtration_vect_).
                super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar8 != pvVar1; pvVar8 = pvVar8 + 1) {
    ppVar2 = pvVar8->m_ptr;
    local_b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
    ;
    local_a8 = "";
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x48);
    local_168 = (undefined **)((ulong)local_168 & 0xffffffffffffff00);
    local_160 = 0;
    sStack_158.pi_ = (sp_counted_base *)0x0;
    __begin0.super_type.m_iterator.m_ptr =
         (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
          )((long)"returnValue.second == false" + 0x16);
    __begin0._8_8_ = (long)"returnValue.second == false" + 0x1b;
    local_130.
    super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin.sib_._0_1_ = 0;
    local_130.
    super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin.sh_.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
          *)&PTR__lazy_ostream_001c1f38;
    local_130.
    super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin.st_ = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)
                   &boost::unit_test::lazy_ostream::inst;
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
    ;
    local_c8 = "";
    local_130.
    super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
    .m_End.sh_.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
          *)&__begin0;
    boost::test_tools::tt_detail::report_assertion(&local_168,&local_130,&local_d0,0x48,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_158);
    poVar5 = std::operator<<((ostream *)&std::clog,
                             "test_iterators_on_empty_simplex_tree - filtration=");
    pFVar6 = (Filtration_value *)&ppVar2->second;
    if (ppVar2 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                   *)0x0) {
      pFVar6 = &Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
                Filtration_simplex_base_real::inf_;
    }
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
                                  *)pFVar6)->super_Filtration_simplex_base).filt_);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  return;
}

Assistant:

void test_iterators_on_empty_simplex_tree(const typeST& tst) {
  std::clog << "Iterator on vertices: " << std::endl;
  for (auto vertex : tst.complex_vertex_range()) {
    std::clog << "vertice:" << vertex << std::endl;
    BOOST_CHECK(false); // shall be empty
  }
  std::clog << "Iterator on simplices: " << std::endl;
  for (auto simplex : tst.complex_simplex_range()) {
    BOOST_CHECK(simplex != simplex); // shall be empty - to remove warning of non-used simplex
  }

  std::clog
      << "Iterator on Simplices in the filtration, with [filtration value]:"
      << std::endl;
  for (auto f_simplex : tst.filtration_simplex_range()) {
    BOOST_CHECK(false); // shall be empty
    std::clog << "test_iterators_on_empty_simplex_tree - filtration="
        << tst.filtration(f_simplex) << std::endl;
  }
}